

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymul.hpp
# Opt level: O1

void polymul_internal::taylor_inplace_multiplier<double,_2,_4,_8,_3>::mul(double *p1,double *p2)

{
  int iVar1;
  long lVar2;
  int j;
  long lVar3;
  double *pdVar4;
  bool bVar5;
  
  iVar1 = binomial(5,3);
  pdVar4 = p1 + iVar1;
  iVar1 = binomial(4,2);
  lVar2 = 0;
  do {
    lVar3 = 0;
    do {
      pdVar4[lVar3] = p1[lVar2 + 1] * p2[iVar1 + lVar3] + pdVar4[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    pdVar4 = pdVar4 + 1;
    bVar5 = lVar2 == 0;
    lVar2 = lVar2 + 1;
  } while (bVar5);
  taylor_inplace_multiplier<double,_2,_4,_8,_4>::mul(p1,p2);
  return;
}

Assistant:

static void mul(numtype p1[], const numtype p2[]) {
    if (i2 <= Ndeg2) {
      // M1(Ndeg-i2)*M2(i2) -> M1(Ndeg)
      polynomial_multiplier<numtype, Nvar - 1, Ndeg - i2, i2>::mul(
          p1 + binomial(Nvar + Ndeg - 1, Ndeg - 1),
          p1 + binomial(Nvar + Ndeg - i2 - 1, Ndeg - i2 - 1),
          p2 + binomial(Nvar + i2 - 1, i2 - 1));
    }
    taylor_inplace_multiplier<numtype, Nvar, Ndeg, Ndeg2, i2 + 1> // Back to (2), or
                                                                  // to (3) when i2+1
                                                                  // == Ndeg
        ::mul(p1, p2);
  }